

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O1

void __thiscall QKeySequenceEdit::keyPressEvent(QKeySequenceEdit *this,QKeyEvent *e)

{
  long lVar1;
  uint *puVar2;
  QKeySequenceEditPrivate *this_00;
  long lVar3;
  QArrayData *pQVar4;
  bool bVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  char cVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  long extraout_RDX;
  long lVar13;
  uint uVar14;
  undefined1 *puVar15;
  long lVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  QStringView QVar18;
  QAnyStringView QVar19;
  QStringView QVar20;
  QArrayData *local_c0 [3];
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  undefined1 *local_98;
  QString local_88;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QKeySequenceEditPrivate **)(this + 8);
  uVar11 = QKeyEvent::modifiers();
  uVar14 = *(uint *)(e + 0x40);
  lVar3 = (this_00->finishingKeyCombinations).d.size;
  if (lVar3 == 0) {
LAB_00414846:
    lVar13 = -1;
  }
  else {
    lVar13 = extraout_RDX;
    lVar16 = -4;
    do {
      lVar1 = lVar3 * -4 + lVar16;
      if (lVar1 == -4) goto LAB_00414840;
      lVar13 = lVar16 + 4;
      puVar2 = (uint *)((long)&(this_00->finishingKeyCombinations).d.ptr[1].combination + lVar16);
      lVar16 = lVar13;
    } while (*puVar2 != (uVar11 | uVar14));
    lVar13 = lVar13 >> 2;
LAB_00414840:
    if (lVar1 == -4) goto LAB_00414846;
  }
  if (lVar13 != -1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QKeySequenceEditPrivate::finishEditing(this_00);
      return;
    }
    goto LAB_00414ca7;
  }
  if (this_00->prevKey == -1) {
    clear(this);
    this_00->prevKey = uVar14;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (storage_type_conflict *)0x0;
  local_58.d.size = 0;
  QLineEdit::setPlaceholderText(this_00->lineEdit,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((3 < uVar14 + 0xfeffffe0) && (uVar14 != 0x1ffffff)) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QLineEdit::selectedText(&local_58,this_00->lineEdit);
    qVar8 = local_58.d.size;
    if (((undefined1 *)local_58.d.size == (undefined1 *)0x0) ||
       (QLineEdit::text(&local_70,this_00->lineEdit), local_58.d.size != local_70.d.size)) {
      cVar9 = '\0';
    }
    else {
      QVar18.m_data = local_58.d.ptr;
      QVar18.m_size = local_58.d.size;
      QVar20.m_data = local_70.d.ptr;
      QVar20.m_size = local_70.d.size;
      cVar9 = QtPrivate::equalStrings(QVar18,QVar20);
    }
    if (((undefined1 *)qVar8 != (undefined1 *)0x0) &&
       (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (((cVar9 == '\0') || (clear(this), uVar14 != 0x1000003)) &&
       (this_00->keyNum < this_00->maximumSequenceLength)) {
      uVar11 = QKeyEvent::modifiers();
      if ((uVar11 >> 0x19 & 1) == 0) {
        uVar11 = QKeyEvent::modifiers();
        pQVar4 = *(QArrayData **)(e + 0x28);
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uVar14 = uVar11 & 0x1c000000 | uVar14;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
      else {
        local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QKeyMapper::possibleKeys((QKeyEvent *)&local_88);
        uVar17 = local_88.d.size & 0xffffffff;
        if (uVar17 != 0) {
          if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
            bVar10 = false;
          }
          else {
            puVar15 = (undefined1 *)0x0;
            bVar10 = false;
            do {
              uVar11 = *(uint *)(local_88.d.ptr + (long)puVar15 * 2);
              iVar12 = QKeyEvent::modifiers();
              if ((uVar11 - uVar14 == iVar12) ||
                 ((uVar11 == uVar14 && (iVar12 = QKeyEvent::modifiers(), iVar12 == 0x2000000)))) {
                bVar5 = false;
                bVar10 = true;
                uVar14 = uVar11;
              }
              else {
                bVar5 = true;
              }
            } while ((bVar5) && (puVar15 = puVar15 + 1, puVar15 < (ulong)local_88.d.size));
          }
          if (!bVar10) {
            uVar14 = *(uint *)local_88.d.ptr;
          }
        }
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
          }
        }
        if (uVar17 == 0) goto LAB_00414c59;
      }
      this_00->key[this_00->keyNum].combination = uVar14;
      this_00->keyNum = this_00->keyNum + 1;
      QKeySequenceEditPrivate::rebuildKeySequence(this_00);
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QKeySequence::toString((SequenceFormat)&local_88);
      if (this_00->keyNum < this_00->maximumSequenceLength) {
        QMetaObject::tr((char *)local_c0,(char *)&staticMetaObject,0x6e5800);
        QVar19.m_size = (size_t)local_c0;
        QVar19.field_0.m_data = &local_a8;
        QString::arg_impl(QVar19,(int)local_88.d.ptr,(QChar)(char16_t)local_88.d.size);
        pcVar7 = local_88.d.ptr;
        pDVar6 = local_88.d.d;
        puVar15 = local_98;
        pQVar4 = local_a8;
        local_a8 = &(local_88.d.d)->super_QArrayData;
        local_88.d.d = (Data *)pQVar4;
        local_88.d.ptr = pcStack_a0;
        pcStack_a0 = pcVar7;
        local_98 = (undefined1 *)local_88.d.size;
        local_88.d.size = (qsizetype)puVar15;
        if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
        if (local_c0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_c0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c0[0],2,0x10);
          }
        }
      }
      QLineEdit::setText(this_00->lineEdit,&local_88);
      e[0xc] = (QKeyEvent)0x1;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
LAB_00414c59:
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00414ca7:
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QKeySequenceEdit);

    if (d->finishingKeyCombinations.contains(e->keyCombination())) {
        d->finishEditing();
        return;
    }

    int nextKey = e->key();

    if (d->prevKey == -1) {
        clear();
        d->prevKey = nextKey;
    }

    d->lineEdit->setPlaceholderText(QString());
    if (nextKey == Qt::Key_Control
            || nextKey == Qt::Key_Shift
            || nextKey == Qt::Key_Meta
            || nextKey == Qt::Key_Alt
            || nextKey == Qt::Key_unknown) {
        return;
    }

    QString selectedText = d->lineEdit->selectedText();
    if (!selectedText.isEmpty() && selectedText == d->lineEdit->text()) {
        clear();
        if (nextKey == Qt::Key_Backspace)
            return;
    }

    if (d->keyNum >= d->maximumSequenceLength)
        return;

    if (e->modifiers() & Qt::ShiftModifier) {
        const QList<QKeyCombination> possibleKeys = QKeyMapper::possibleKeys(e);
        int pkTotal = possibleKeys.size();
        if (!pkTotal)
            return;
        bool found = false;
        for (int i = 0; i < possibleKeys.size(); ++i) {
            const int key = possibleKeys.at(i).toCombined();
            if (key - nextKey == int(e->modifiers())
                || (key == nextKey && e->modifiers() == Qt::ShiftModifier)) {
                nextKey = key;
                found = true;
                break;
            }
        }
        // Use as fallback
        if (!found)
            nextKey = possibleKeys.first().toCombined();
    } else {
        nextKey |= d->translateModifiers(e->modifiers(), e->text());
    }


    d->key[d->keyNum] = QKeyCombination::fromCombined(nextKey);
    d->keyNum++;

    d->rebuildKeySequence();
    QString text = d->keySequence.toString(QKeySequence::NativeText);
    if (d->keyNum < d->maximumSequenceLength) {
        //: This text is an "unfinished" shortcut, expands like "Ctrl+A, ..."
        text = tr("%1, ...").arg(text);
    }
    d->lineEdit->setText(text);
    e->accept();
}